

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow **ppIVar1;
  int i;
  ImVector<ImGuiWindow_*> *this;
  
  i = (GImGui->Windows).Size;
  this = &GImGui->Windows;
  while( true ) {
    if (i < 1) {
      return false;
    }
    i = i + -1;
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
    if (*ppIVar1 == potential_above) break;
    if (*ppIVar1 == potential_below) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}